

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

bool __thiscall pbrt::Image::WriteEXR(Image *this,string *name,ImageMetadata *metadata)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> aVar4;
  undefined8 uVar5;
  undefined1 auVar6 [64];
  bool bVar7;
  int iVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  char *pcVar11;
  _Base_ptr p_Var12;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aVar13;
  uint uVar14;
  long lVar15;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int in_XMM2_Da;
  int in_XMM2_Db;
  int in_XMM2_Dc;
  int in_XMM2_Dd;
  undefined1 auVar22 [16];
  OutputFile file;
  Header header;
  FrameBuffer fb;
  float m [4] [4];
  undefined1 local_1f8 [16];
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  aStack_1e8;
  V2f VStack_1d8;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_1c0;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_1a0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_180;
  Image *local_160;
  string local_158 [56];
  Box2i local_120;
  undefined8 local_110;
  undefined8 local_108;
  Tuple2<pbrt::Point2,_float> local_100;
  Tuple2<pbrt::Point2,_float> local_f8;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  local_f0;
  ColorEncodingHandle local_c0;
  Chromaticities local_b8;
  undefined1 auStack_98 [32];
  Matrix44<float> local_78;
  undefined1 auVar16 [16];
  
  if (this->format - Half < 2) {
    TVar3 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    local_110 = 0;
    aVar4 = (metadata->fullResolution).optionalValue;
    uVar14 = 0xff;
    if ((metadata->fullResolution).set == false) {
      uVar14 = 0;
    }
    auVar16._8_8_ = 0;
    auVar16._0_4_ = TVar3.x;
    auVar16._4_4_ = TVar3.y;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = aVar4;
    auVar16 = vpblendmd_avx512vl(auVar16,auVar20);
    bVar7 = (bool)((byte)uVar14 & 1);
    auVar17._0_4_ = (uint)bVar7 * auVar16._0_4_ | (uint)!bVar7 * in_XMM2_Da;
    bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar7 * auVar16._4_4_ | (uint)!bVar7 * in_XMM2_Db;
    bVar7 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar7 * auVar16._8_4_ | (uint)!bVar7 * in_XMM2_Dc;
    bVar7 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar7 * auVar16._12_4_ | (uint)!bVar7 * in_XMM2_Dd;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = aVar4;
    auVar20 = vpcmpeqd_avx(auVar20,auVar21);
    auVar16 = vpaddd_avx(auVar17,auVar20);
    local_108 = auVar16._0_8_;
    if ((metadata->pixelBounds).set == false) {
      auVar22 = (undefined1  [16])0x0;
    }
    else {
      TVar3 = *(Tuple2<pbrt::Point2,_int> *)((long)&(metadata->pixelBounds).optionalValue + 8);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)&(metadata->pixelBounds).optionalValue;
    }
    auVar19._8_8_ = 0;
    auVar19._0_4_ = TVar3.x;
    auVar19._4_4_ = TVar3.y;
    auVar16 = vpaddd_avx(auVar19,auVar20);
    local_120 = (Box2i)vpunpcklqdq_avx(auVar22,auVar16);
    AllChannelsDesc((ImageChannelDesc *)local_1f8,this);
    imageToFrameBuffer((FrameBuffer *)&local_f0,this,(ImageChannelDesc *)local_1f8,&local_120);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_1f8);
    local_1f8._0_8_ = (memory_resource *)0x0;
    Imf_2_5::Header::Header
              ((Header *)0x3f800000,0x3f800000,local_158,&local_110,&local_120,local_1f8,0,3);
    p_Var9 = (_Rb_tree_node_base *)Imf_2_5::FrameBuffer::begin();
    for (; p_Var10 = (_Rb_tree_node_base *)Imf_2_5::FrameBuffer::end(), p_Var9 != p_Var10;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      pcVar11 = (char *)Imf_2_5::Header::channels();
      Imf_2_5::Channel::Channel((Channel *)local_1f8,p_Var9[9]._M_color,1,1,false);
      Imf_2_5::ChannelList::insert(pcVar11,(Channel *)(p_Var9 + 1));
    }
    if ((metadata->renderTimeSeconds).set != false) {
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f8);
      local_1f8._0_8_ = &PTR__Attribute_02d09e80;
      local_1f8._8_4_ = (metadata->renderTimeSeconds).optionalValue;
      Imf_2_5::Header::insert((char *)local_158,(Attribute *)"renderTimeSeconds");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
    }
    if ((metadata->cameraFromWorld).set == true) {
      lVar15 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + lVar15);
        uVar5 = puVar2[1];
        *(undefined8 *)(auStack_98 + lVar15 + -0x20) = *puVar2;
        *(undefined8 *)(auStack_98 + lVar15 + -0x18) = uVar5;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x40);
      auVar18._8_4_ = local_b8.green.x;
      auVar18._12_4_ = local_b8.green.y;
      auVar18._0_4_ = local_b8.red.x;
      auVar18._4_4_ = local_b8.red.y;
      auVar18._16_4_ = local_b8.blue.x;
      auVar18._20_4_ = local_b8.blue.y;
      auVar18._24_4_ = local_b8.white.x;
      auVar18._28_4_ = local_b8.white.y;
      auVar18._32_32_ = auStack_98;
      auVar18 = vmovdqu64_avx512f(auVar18);
      local_78.x = (float  [4] [4])vmovdqu64_avx512f(auVar18);
      Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_2_5::Matrix44<float>_> *)local_1f8,&local_78);
      Imf_2_5::Header::insert((char *)local_158,(Attribute *)"worldToCamera");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
    }
    if ((metadata->NDCFromWorld).set == true) {
      lVar15 = 0;
      do {
        puVar2 = (undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + lVar15);
        uVar5 = puVar2[1];
        *(undefined8 *)(auStack_98 + lVar15 + -0x20) = *puVar2;
        *(undefined8 *)(auStack_98 + lVar15 + -0x18) = uVar5;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x40);
      auVar6._8_4_ = local_b8.green.x;
      auVar6._12_4_ = local_b8.green.y;
      auVar6._0_4_ = local_b8.red.x;
      auVar6._4_4_ = local_b8.red.y;
      auVar6._16_4_ = local_b8.blue.x;
      auVar6._20_4_ = local_b8.blue.y;
      auVar6._24_4_ = local_b8.white.x;
      auVar6._28_4_ = local_b8.white.y;
      auVar6._32_32_ = auStack_98;
      auVar18 = vmovdqu64_avx512f(auVar6);
      local_78.x = (float  [4] [4])vmovdqu64_avx512f(auVar18);
      Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_2_5::Matrix44<float>_> *)local_1f8,&local_78);
      Imf_2_5::Header::insert((char *)local_158,(Attribute *)"worldToNDC");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
    }
    local_160 = this;
    if ((metadata->samplesPerPixel).set == true) {
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f8);
      local_1f8._0_8_ = &PTR__Attribute_02d09f10;
      local_1f8._8_4_ = (metadata->samplesPerPixel).optionalValue;
      Imf_2_5::Header::insert((char *)local_158,(Attribute *)"samplesPerPixel");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
    }
    if ((metadata->MSE).set == true) {
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f8);
      local_1f8._0_8_ = &PTR__Attribute_02d09e80;
      local_1f8._8_4_ = (metadata->MSE).optionalValue;
      Imf_2_5::Header::insert((char *)local_158,(Attribute *)"MSE");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
    }
    p_Var12 = (metadata->stringVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(metadata->stringVectors)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      do {
        Imf_2_5::
        TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_1f8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(p_Var12 + 2));
        Imf_2_5::Header::insert(local_158,(Attribute *)(p_Var12 + 1));
        local_1f8._0_8_ = &PTR__TypedAttribute_02d09da0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1f8 + 8));
        Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
    aVar13 = (metadata->colorSpace).optionalValue;
    if (aVar13 == (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )0x0) {
      aVar13 = RGBColorSpace::sRGB;
    }
    if ((metadata->colorSpace).set == false) {
      aVar13 = RGBColorSpace::sRGB;
    }
    bVar7 = RGBColorSpace::operator!=((RGBColorSpace *)aVar13,(RGBColorSpace *)RGBColorSpace::sRGB);
    if (bVar7) {
      aVar13 = *(aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                 *)(metadata->colorSpace).optionalValue.__data;
      if (aVar13 == (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                     )0x0) {
        aVar13 = RGBColorSpace::sRGB;
      }
      if ((metadata->colorSpace).set == false) {
        aVar13 = RGBColorSpace::sRGB;
      }
      local_1f8._0_8_ = *(undefined8 *)aVar13;
      local_78.x[0]._0_8_ = ((Point2f *)((long)aVar13 + 8))->super_Tuple2<pbrt::Point2,_float>;
      local_f8 = ((Point2f *)((long)aVar13 + 0x10))->super_Tuple2<pbrt::Point2,_float>;
      local_100 = ((Point2f *)((long)aVar13 + 0x18))->super_Tuple2<pbrt::Point2,_float>;
      Imf_2_5::Chromaticities::Chromaticities
                (&local_b8,(Vec2 *)local_1f8,(Vec2 *)&local_78,(Vec2 *)&local_f8,(Vec2 *)&local_100)
      ;
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f8);
      local_1f8._0_8_ = &PTR__Attribute_02d09f58;
      local_1f8._8_4_ = local_b8.red.x;
      local_1f8._12_4_ = local_b8.red.y;
      aStack_1e8.fixed[0] = (int)local_b8.green.x;
      aStack_1e8.fixed[1] = (int)local_b8.green.y;
      aStack_1e8.fixed[2] = (int)local_b8.blue.x;
      aStack_1e8.fixed[3] = (int)local_b8.blue.y;
      VStack_1d8 = local_b8.white;
      Imf_2_5::Header::insert((char *)local_158,(Attribute *)"chromaticities");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f8);
    }
    pcVar11 = (name->_M_dataplus)._M_p;
    iVar8 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile((OutputFile *)local_1f8,pcVar11,(Header *)local_158,iVar8);
    Imf_2_5::OutputFile::setFrameBuffer((FrameBuffer *)local_1f8);
    Imf_2_5::OutputFile::writePixels((int)local_1f8);
    Imf_2_5::OutputFile::~OutputFile((OutputFile *)local_1f8);
    Imf_2_5::Header::~Header((Header *)local_158);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree(&local_f0);
    bVar7 = true;
  }
  else {
    if (this->format != U256) {
      LogFatal<char_const(&)[35]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x444,"Check failed: %s",(char (*) [35])"Is16Bit(format) || Is32Bit(format)");
    }
    local_c0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    ConvertToFormat((Image *)local_1f8,this,Half,&local_c0);
    bVar7 = WriteEXR((Image *)local_1f8,name,metadata);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_180);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_1a0);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              (&local_1c0);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&aStack_1e8);
  }
  return bVar7;
}

Assistant:

bool Image::WriteEXR(const std::string &name, const ImageMetadata &metadata) const {
    if (Is8Bit(format))
        return ConvertToFormat(PixelFormat::Half).WriteEXR(name, metadata);
    CHECK(Is16Bit(format) || Is32Bit(format));

    try {
        Imath::Box2i displayWindow, dataWindow;
        if (metadata.fullResolution)
            // Agan, -1 offsets to handle inclusive indexing in OpenEXR...
            displayWindow = {Imath::V2i(0, 0),
                             Imath::V2i(metadata.fullResolution->x - 1,
                                        metadata.fullResolution->y - 1)};
        else
            displayWindow = {Imath::V2i(0, 0),
                             Imath::V2i(resolution.x - 1, resolution.y - 1)};

        if (metadata.pixelBounds)
            dataWindow = {
                Imath::V2i(metadata.pixelBounds->pMin.x, metadata.pixelBounds->pMin.y),
                Imath::V2i(metadata.pixelBounds->pMax.x - 1,
                           metadata.pixelBounds->pMax.y - 1)};
        else
            dataWindow = {Imath::V2i(0, 0),
                          Imath::V2i(resolution.x - 1, resolution.y - 1)};

        Imf::FrameBuffer fb = imageToFrameBuffer(*this, AllChannelsDesc(), dataWindow);

        Imf::Header header(displayWindow, dataWindow);
        for (auto iter = fb.begin(); iter != fb.end(); ++iter)
            header.channels().insert(iter.name(), iter.slice().type);

        if (metadata.renderTimeSeconds)
            header.insert("renderTimeSeconds",
                          Imf::FloatAttribute(*metadata.renderTimeSeconds));
        if (metadata.cameraFromWorld) {
            float m[4][4];
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    m[i][j] = (*metadata.cameraFromWorld)[i][j];
            header.insert("worldToCamera", Imf::M44fAttribute(m));
        }
        if (metadata.NDCFromWorld) {
            float m[4][4];
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    m[i][j] = (*metadata.NDCFromWorld)[i][j];
            header.insert("worldToNDC", Imf::M44fAttribute(m));
        }
        if (metadata.samplesPerPixel)
            header.insert("samplesPerPixel",
                          Imf::IntAttribute(*metadata.samplesPerPixel));
        if (metadata.MSE)
            header.insert("MSE", Imf::FloatAttribute(*metadata.MSE));
        for (const auto &iter : metadata.stringVectors)
            header.insert(iter.first, Imf::StringVectorAttribute(iter.second));

        // The OpenEXR spec says that the default is sRGB if no
        // chromaticities are provided.  It should be innocuous to write
        // the sRGB primaries anyway, but for completely indecipherable
        // reasons, OSX's Preview.app decides to gamma correct the pixels
        // in EXR files if it finds primaries.  So, we don't write them in
        // that case in the interests of nicer looking images on the
        // screen.
        if (*metadata.GetColorSpace() != *RGBColorSpace::sRGB) {
            const RGBColorSpace &cs = *metadata.GetColorSpace();
            Imf::Chromaticities chromaticities(
                Imath::V2f(cs.r.x, cs.r.y), Imath::V2f(cs.g.x, cs.g.y),
                Imath::V2f(cs.b.x, cs.b.y), Imath::V2f(cs.w.x, cs.w.y));
            header.insert("chromaticities", Imf::ChromaticitiesAttribute(chromaticities));
        }

        Imf::OutputFile file(name.c_str(), header);
        file.setFrameBuffer(fb);
        file.writePixels(resolution.y);
    } catch (const std::exception &exc) {
        Error("%s: error writing EXR: %s", name.c_str(), exc.what());
        return false;
    }

    return true;
}